

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::Throw_ConvertFail_Str2ArrF(X3DImporter *this,string *pAttrValue)

{
  int iVar1;
  DeadlyImportError *this_00;
  undefined4 extraout_var;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  iVar1 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,(char *)CONCAT44(extraout_var,iVar1),&local_c1);
  std::operator+(&local_a0,"In <",&local_c0);
  std::operator+(&local_80,&local_a0,"> failed to convert attribute value \"");
  std::operator+(&local_60,&local_80,pAttrValue);
  std::operator+(&local_40,&local_60,"\" from string to array of floats.");
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void X3DImporter::Throw_ConvertFail_Str2ArrF(const std::string& pAttrValue)
{
	throw DeadlyImportError("In <" + std::string(mReader->getNodeName()) + "> failed to convert attribute value \"" + pAttrValue +
							"\" from string to array of floats.");
}